

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::UnaryExpression::fromSyntax
          (Compilation *compilation,PostfixUnaryExpressionSyntax *syntax,ASTContext *context)

{
  Token *this;
  ulong uVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  Type *this_00;
  bool bVar2;
  Expression *pEVar3;
  UnaryExpression *expr;
  SourceLocation SVar4;
  Diagnostic *diag;
  SourceRange sourceRange;
  UnaryOperator local_5c;
  Type *local_58;
  SourceRange local_50;
  SourceRange local_40;
  
  pEVar3 = Expression::create(compilation,(syntax->operand).ptr,context,
                              (bitmask<slang::ast::ASTFlags>)0x4000100000,(Type *)0x0);
  local_58 = (pEVar3->type).ptr;
  local_5c = OpInfo::getUnary((syntax->super_ExpressionSyntax).super_SyntaxNode.kind);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  this = &syntax->operatorToken;
  local_50 = parsing::Token::range(this);
  this_00 = local_58;
  expr = BumpAllocator::
         emplace<slang::ast::UnaryExpression,slang::ast::UnaryOperator,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange,slang::SourceRange>
                   (&compilation->super_BumpAllocator,&local_5c,local_58,pEVar3,&local_40,&local_50)
  ;
  bVar2 = Expression::bad(pEVar3);
  if (!bVar2) {
    SVar4 = parsing::Token::location(this);
    bVar2 = Expression::requireLValue
                      (pEVar3,context,SVar4,(bitmask<slang::ast::AssignFlags>)0x0,(Expression *)0x0)
    ;
    if (bVar2) {
      uVar1 = (context->flags).m_bits;
      if (((uint)uVar1 & 0x28) == 0x20 || (uVar1 & 0x10) != 0) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        ASTContext::addDiag(context,(DiagCode)0x5b0007,sourceRange);
      }
      else {
        bVar2 = Type::isNumeric(this_00);
        if (bVar2) {
          syntax_00._M_ptr =
               (syntax->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax_00._M_extent._M_extent_value =
               (syntax->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          ASTContext::setAttributes(context,&expr->super_Expression,syntax_00);
          return &expr->super_Expression;
        }
        SVar4 = parsing::Token::location(this);
        diag = ASTContext::addDiag(context,(DiagCode)0x320007,SVar4);
        ast::operator<<(diag,this_00);
        Diagnostic::operator<<(diag,pEVar3->sourceRange);
      }
    }
  }
  pEVar3 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar3;
}

Assistant:

Expression& UnaryExpression::fromSyntax(Compilation& compilation,
                                        const PostfixUnaryExpressionSyntax& syntax,
                                        const ASTContext& context) {
    // This method is only ever called for postincrement and postdecrement operators, so
    // the operand must be an lvalue.
    Expression& operand = create(compilation, *syntax.operand, context,
                                 ASTFlags::LValue | ASTFlags::LAndRValue);
    const Type* type = operand.type;

    Expression* result = compilation.emplace<UnaryExpression>(OpInfo::getUnary(syntax.kind), *type,
                                                              operand, syntax.sourceRange(),
                                                              syntax.operatorToken.range());
    if (operand.bad() || !operand.requireLValue(context, syntax.operatorToken.location()))
        return badExpr(compilation, result);

    if ((context.flags.has(ASTFlags::NonProcedural) &&
         !context.flags.has(ASTFlags::AssignmentAllowed)) ||
        context.flags.has(ASTFlags::AssignmentDisallowed)) {
        context.addDiag(diag::IncDecNotAllowed, syntax.sourceRange());
        return badExpr(compilation, result);
    }

    if (!type->isNumeric()) {
        auto& diag = context.addDiag(diag::BadUnaryExpression, syntax.operatorToken.location());
        diag << *type;
        diag << operand.sourceRange;
        return badExpr(compilation, result);
    }

    context.setAttributes(*result, syntax.attributes);
    return *result;
}